

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

logic_t __thiscall slang::SVInt::reductionAnd(SVInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  SVInt *in_RDI;
  uint32_t i_1;
  uint32_t i;
  uint32_t words;
  bitwidth_t bitsInMsw;
  uint64_t mask;
  uint local_28;
  uint local_24;
  bitwidth_t local_1c;
  ulong local_18 [2];
  logic_t local_1;
  
  getTopWordMask(in_RDI,&local_1c,local_18);
  if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
    bVar2 = isSingleWord(in_RDI);
    if (bVar2) {
      logic_t::logic_t(&local_1,(in_RDI->super_SVIntStorage).field_0.val == local_18[0]);
    }
    else {
      for (local_28 = 0; uVar3 = getNumWords((SVInt *)0x20a7ce), local_28 < uVar3 - 1;
          local_28 = local_28 + 1) {
        if ((in_RDI->super_SVIntStorage).field_0.pVal[local_28] != 0xffffffffffffffff) {
          logic_t::logic_t(&local_1,'\0');
          return (logic_t)local_1.value;
        }
      }
      puVar1 = (in_RDI->super_SVIntStorage).field_0.pVal;
      uVar3 = getNumWords((SVInt *)0x20a81d);
      logic_t::logic_t(&local_1,puVar1[uVar3 - 1] == local_18[0]);
    }
  }
  else {
    uVar3 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
    for (local_24 = 0; local_24 < uVar3 - 1; local_24 = local_24 + 1) {
      if (((in_RDI->super_SVIntStorage).field_0.pVal[local_24] |
          (in_RDI->super_SVIntStorage).field_0.pVal[local_24 + uVar3]) != 0xffffffffffffffff) {
        logic_t::logic_t(&local_1,'\0');
        return (logic_t)local_1.value;
      }
    }
    if (((in_RDI->super_SVIntStorage).field_0.pVal[uVar3 - 1] |
        (in_RDI->super_SVIntStorage).field_0.pVal[uVar3 * 2 - 1]) == local_18[0]) {
      local_1.value = 0x80;
    }
    else {
      logic_t::logic_t(&local_1,'\0');
    }
  }
  return (logic_t)local_1.value;
}

Assistant:

logic_t SVInt::reductionAnd() const {
    uint64_t mask;
    bitwidth_t bitsInMsw;
    getTopWordMask(bitsInMsw, mask);

    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words - 1; i++) {
            if ((pVal[i] | pVal[i + words]) != UINT64_MAX)
                return logic_t(false);
        }
        if ((pVal[words - 1] | pVal[words * 2 - 1]) != mask)
            return logic_t(false);
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val == mask);
    else {
        for (uint32_t i = 0; i < getNumWords() - 1; i++) {
            if (pVal[i] != UINT64_MAX)
                return logic_t(false);
        }
        return logic_t(pVal[getNumWords() - 1] == mask);
    }
}